

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void loop_filter_rows(YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,int start,int stop,
                     int *planes_to_lf,int lpf_opt_level)

{
  int in_ECX;
  int in_R8D;
  int *in_R9;
  bool bVar1;
  int in_stack_00000008;
  TX_SIZE tx_buf [32];
  AV1_DEBLOCKING_PARAMETERS params_buf [32];
  int dir;
  int plane;
  int mi_row;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  MACROBLOCKD *in_stack_fffffffffffffd80;
  macroblockd_plane *in_stack_fffffffffffffd88;
  AV1_COMMON *in_stack_fffffffffffffd90;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  AV1LfSync *in_stack_fffffffffffffdc0;
  aom_internal_error_info *in_stack_fffffffffffffdc8;
  AV1_DEBLOCKING_PARAMETERS *in_stack_fffffffffffffdd0;
  TX_SIZE *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  int local_64;
  int local_60;
  int local_5c;
  
  local_5c = in_ECX;
  do {
    if (in_R8D <= local_5c) {
      return;
    }
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      if (in_stack_00000008 == 2) {
        if (local_60 == 0) {
          bVar1 = *in_R9 == 0;
        }
        else if (local_60 == 1) {
          bVar1 = false;
          if (in_R9[1] == 0) {
            bVar1 = in_R9[2] == 0;
          }
        }
        else {
          if (local_60 != 2) goto LAB_006f500c;
          bVar1 = true;
        }
      }
      else {
LAB_006f500c:
        bVar1 = in_R9[local_60] == 0;
      }
      if (!bVar1) {
        for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
          av1_thread_loop_filter_rows
                    (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                     in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                     in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0,
                     in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                     in_stack_fffffffffffffde0);
        }
      }
    }
    local_5c = local_5c + 0x20;
  } while( true );
}

Assistant:

static void loop_filter_rows(YV12_BUFFER_CONFIG *frame, AV1_COMMON *cm,
                             MACROBLOCKD *xd, int start, int stop,
                             const int planes_to_lf[MAX_MB_PLANE],
                             int lpf_opt_level) {
  // Filter top rows of all planes first, in case the output can be partially
  // reconstructed row by row.
  int mi_row, plane, dir;

  AV1_DEBLOCKING_PARAMETERS params_buf[MAX_MIB_SIZE];
  TX_SIZE tx_buf[MAX_MIB_SIZE];
  for (mi_row = start; mi_row < stop; mi_row += MAX_MIB_SIZE) {
    for (plane = 0; plane < MAX_MB_PLANE; ++plane) {
      if (skip_loop_filter_plane(planes_to_lf, plane, lpf_opt_level)) {
        continue;
      }

      for (dir = 0; dir < 2; ++dir) {
        av1_thread_loop_filter_rows(frame, cm, xd->plane, xd, mi_row, plane,
                                    dir, lpf_opt_level, /*lf_sync=*/NULL,
                                    xd->error_info, params_buf, tx_buf,
                                    MAX_MIB_SIZE_LOG2);
      }
    }
  }
}